

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::RefBuilderSmall
::attachBuildRefs(RefBuilderSmall *this,
                 BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  BuildRef *pBVar5;
  long *plVar6;
  Vec3fx *pVVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  Geometry *pGVar11;
  BVH *pBVar12;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  BuildRef *pBVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined8 uVar26;
  ThreadLocal2 *this_02;
  ulong uVar27;
  undefined4 *puVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  float *pfVar32;
  long lVar33;
  size_t sVar34;
  ulong uVar35;
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  vuint<4> vprimID;
  PrimInfo pinfo;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  PrimRef *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  RefBuilderSmall *local_d8;
  long *local_d0;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  long local_48;
  long local_40;
  
  sVar34 = this->objectID_;
  pGVar11 = (topBuilder->scene->geometries).items[sVar34].ptr;
  uVar9 = pGVar11->numPrimitives;
  uVar35 = CONCAT44(0,uVar9);
  lVar30 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_160._0_8_ = lVar30 + 0x550;
  if (lVar30 == 0) {
    local_160._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_160[8] = false;
  local_150 = (undefined1  [16])0x0;
  local_140 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar35 != 0) {
    sVar34 = uVar35 << 5;
    (**((MemoryMonitorInterface *)local_160._0_8_)->_vptr_MemoryMonitorInterface)
              (local_160._0_8_,sVar34,0);
    if (uVar9 < 0xe0000) {
      local_140 = (PrimRef *)alignedMalloc(sVar34,0x20);
    }
    else {
      local_140 = (PrimRef *)os_malloc(sVar34,(bool *)(local_160 + 8));
    }
    local_150._8_4_ = uVar9;
    local_150._0_8_ = uVar35;
    local_150._12_4_ = 0;
    sVar34 = local_d8->objectID_;
  }
  sse2::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar11,(uint)sVar34,uVar35,(mvector<PrimRef> *)local_160
             ,&(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_021a7d38);
    uVar35 = 0;
    do {
      pBVar12 = topBuilder->bvh;
      this_02 = (ThreadLocal2 *)*local_d0;
      if (this_02 == (ThreadLocal2 *)0x0) {
        this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_02);
        (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_02->alloc0).parent = this_02;
        (this_02->alloc0).ptr = (char *)0x0;
        (this_02->alloc0).cur = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).bytesUsed = 0;
        (this_02->alloc0).bytesWasted = 0;
        (this_02->alloc1).parent = this_02;
        (this_02->alloc1).ptr = (char *)0x0;
        (this_02->alloc1).cur = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).bytesUsed = 0;
        (this_02->alloc1).bytesWasted = 0;
        *local_d0 = (long)this_02;
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = CONCAT71(uStack_130._1_7_,1);
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108._M_head_impl = this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_108);
        if (local_108._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_108,
                     local_108._M_head_impl);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      this_00 = &pBVar12->alloc;
      uVar29 = (ulong)(((pBVar12->alloc).use_single_mode ^ 1) << 6);
      local_178 = 0xb0;
      this_01 = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar29);
      if (this_00 != (this_01->alloc)._M_b._M_p) {
        uStack_100 = CONCAT71(uStack_100._1_7_,1);
        local_108._M_head_impl = this_01;
        MutexSys::lock(&this_01->mutex);
        if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((this_01->alloc0).end + (this_01->alloc1).end) -
               ((this_01->alloc0).cur + (this_01->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
          UNLOCK();
        }
        (this_01->alloc0).bytesUsed = 0;
        (this_01->alloc0).bytesWasted = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).ptr = (char *)0x0;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
        (this_01->alloc1).ptr = (char *)0x0;
        (this_01->alloc1).cur = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).bytesUsed = 0;
        (this_01->alloc1).bytesWasted = 0;
        (this_01->alloc1).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
        LOCK();
        (this_01->alloc)._M_b._M_p = this_00;
        UNLOCK();
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = CONCAT71(uStack_130._1_7_,1);
        local_c8._M_head_impl = this_01;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar12->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar12->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar12->alloc).thread_local_allocators,__position,&local_c8._M_head_impl)
          ;
        }
        else {
          *__position._M_current = local_c8._M_head_impl;
          pppTVar2 = &(pBVar12->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if ((char)uStack_100 == '\x01') {
          MutexSys::unlock(&(local_108._M_head_impl)->mutex);
        }
      }
      plVar6 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar29);
      *plVar6 = *plVar6 + local_178;
      lVar30 = *(long *)((long)&(this_02->alloc0).cur + uVar29);
      uVar31 = (ulong)(-(int)lVar30 & 0xf);
      uVar27 = lVar30 + local_178 + uVar31;
      *(ulong *)((long)&(this_02->alloc0).cur + uVar29) = uVar27;
      if (*(ulong *)((long)&(this_02->alloc0).end + uVar29) < uVar27) {
        *(long *)((long)&(this_02->alloc0).cur + uVar29) = lVar30;
        uVar27 = *(ulong *)((long)&(this_02->alloc0).allocBlockSize + uVar29);
        if (uVar27 < local_178 << 2) {
          puVar28 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&local_178);
        }
        else {
          local_138 = (undefined8 *)uVar27;
          puVar28 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&local_138);
          *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar29) = puVar28;
          lVar30 = (*(long *)((long)&(this_02->alloc0).end + uVar29) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar29)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar29);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar29) = lVar30;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar29) = 0;
          *(undefined8 **)((long)&(this_02->alloc0).end + uVar29) = local_138;
          *(ulong *)((long)&(this_02->alloc0).cur + uVar29) = local_178;
          if (local_138 < local_178) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar29) = 0;
            local_138 = *(undefined8 **)((long)&(this_02->alloc0).allocBlockSize + uVar29);
            puVar28 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&local_138);
            *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar29) = puVar28;
            lVar30 = (*(long *)((long)&(this_02->alloc0).end + uVar29) -
                     *(long *)((long)&(this_02->alloc0).cur + uVar29)) +
                     *(long *)((long)&(this_02->alloc0).bytesWasted + uVar29);
            *(long *)((long)&(this_02->alloc0).bytesWasted + uVar29) = lVar30;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar29) = 0;
            *(undefined8 **)((long)&(this_02->alloc0).end + uVar29) = local_138;
            *(ulong *)((long)&(this_02->alloc0).cur + uVar29) = local_178;
            if (local_138 < local_178) {
              *(undefined8 *)((long)&(this_02->alloc0).cur + uVar29) = 0;
              puVar28 = (undefined4 *)0x0;
              goto LAB_00cb2741;
            }
          }
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar29) = lVar30;
        }
      }
      else {
        plVar6 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar29);
        *plVar6 = *plVar6 + uVar31;
        puVar28 = (undefined4 *)
                  ((uVar27 - local_178) + *(long *)((long)&(this_02->alloc0).ptr + uVar29));
      }
LAB_00cb2741:
      uVar29 = local_40 - local_48;
      local_178 = 0xffffffffffffffff;
      uStack_170 = 0xffffffff;
      uStack_16c = 0xffffffff;
      local_98[0] = -NAN;
      local_98[1] = -NAN;
      local_98[2] = -NAN;
      local_98[3] = -NAN;
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      uStack_a0._0_4_ = 0;
      uStack_a0._4_4_ = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = (undefined8 *)0x0;
      uStack_130 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108._M_head_impl = (ThreadLocal2 *)0x0;
      uStack_100 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8._M_head_impl = (ThreadLocal2 *)0x0;
      uStack_c0 = 0;
      if (uVar35 < uVar29) {
        pRVar13 = (topBuilder->bvh->scene->geometries).items;
        pfVar32 = local_140[uVar35].upper.field_0.m128 + 3;
        uVar27 = 0;
        do {
          fVar10 = *pfVar32;
          pGVar11 = pRVar13[(uint)pfVar32[-4]].ptr;
          lVar33 = (ulong)(uint)fVar10 *
                   pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar30 = *(long *)&pGVar11->field_0x58;
          lVar14 = *(long *)&pGVar11[1].time_range.upper;
          p_Var15 = pGVar11[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar14 + (ulong)*(uint *)(lVar30 + lVar33) * (long)p_Var15);
          uVar17 = *puVar4;
          uVar18 = puVar4[1];
          uVar19 = puVar4[2];
          puVar4 = (undefined4 *)(lVar14 + (ulong)*(uint *)(lVar30 + 4 + lVar33) * (long)p_Var15);
          uVar20 = *puVar4;
          uVar21 = puVar4[1];
          uVar22 = puVar4[2];
          puVar4 = (undefined4 *)(lVar14 + (ulong)*(uint *)(lVar30 + 8 + lVar33) * (long)p_Var15);
          uVar23 = *puVar4;
          uVar24 = puVar4[1];
          uVar25 = puVar4[2];
          *(float *)((long)&local_178 + uVar27 * 4) = pfVar32[-4];
          local_98[uVar27] = fVar10;
          *(undefined4 *)((long)&local_138 + uVar27 * 4) = uVar17;
          *(undefined4 *)((long)&local_128 + uVar27 * 4) = uVar18;
          *(undefined4 *)((long)&local_118 + uVar27 * 4) = uVar19;
          *(undefined4 *)((long)&local_108._M_head_impl + uVar27 * 4) = uVar20;
          *(undefined4 *)((long)&local_f8 + uVar27 * 4) = uVar21;
          *(undefined4 *)((long)&local_e8 + uVar27 * 4) = uVar22;
          *(undefined4 *)((long)&local_c8._M_head_impl + uVar27 * 4) = uVar23;
          *(undefined4 *)((long)&local_b8 + uVar27 * 4) = uVar24;
          *(undefined4 *)((long)&local_a8 + uVar27 * 4) = uVar25;
          uVar31 = uVar27 + 1;
          if (2 < uVar27) break;
          lVar30 = uVar27 + uVar35;
          pfVar32 = pfVar32 + 8;
          uVar27 = uVar31;
        } while (lVar30 + 1U < uVar29);
        uVar35 = uVar35 + uVar31;
      }
      else {
        local_178._0_4_ = 0xffffffff;
        local_178._4_4_ = 0xffffffff;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        uStack_b0._0_4_ = 0;
        uStack_b0._4_4_ = 0;
        local_c8._M_head_impl._0_4_ = 0;
        local_c8._M_head_impl._4_4_ = 0;
        uStack_c0._0_4_ = 0;
        uStack_c0._4_4_ = 0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        uStack_e0._0_4_ = 0;
        uStack_e0._4_4_ = 0;
        local_f8._0_4_ = 0;
        local_f8._4_4_ = 0;
        uStack_f0._0_4_ = 0;
        uStack_f0._4_4_ = 0;
        local_108._M_head_impl._0_4_ = 0;
        local_108._M_head_impl._4_4_ = 0;
        uStack_100._0_4_ = 0;
        uStack_100._4_4_ = 0;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        uStack_110._0_4_ = 0;
        uStack_110._4_4_ = 0;
        local_128._0_4_ = 0;
        local_128._4_4_ = 0;
        uStack_120._0_4_ = 0;
        uStack_120._4_4_ = 0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        uStack_130._0_4_ = 0;
        uStack_130._4_4_ = 0;
      }
      *puVar28 = (undefined4)local_138;
      puVar28[1] = local_138._4_4_;
      puVar28[2] = (undefined4)uStack_130;
      puVar28[3] = uStack_130._4_4_;
      puVar28[4] = (undefined4)local_128;
      puVar28[5] = local_128._4_4_;
      puVar28[6] = (undefined4)uStack_120;
      puVar28[7] = uStack_120._4_4_;
      puVar28[8] = (undefined4)local_118;
      puVar28[9] = local_118._4_4_;
      puVar28[10] = (undefined4)uStack_110;
      puVar28[0xb] = uStack_110._4_4_;
      puVar28[0xc] = local_108._M_head_impl._0_4_;
      puVar28[0xd] = local_108._M_head_impl._4_4_;
      puVar28[0xe] = (undefined4)uStack_100;
      puVar28[0xf] = uStack_100._4_4_;
      puVar28[0x10] = (undefined4)local_f8;
      puVar28[0x11] = local_f8._4_4_;
      puVar28[0x12] = (undefined4)uStack_f0;
      puVar28[0x13] = uStack_f0._4_4_;
      puVar28[0x14] = (undefined4)local_e8;
      puVar28[0x15] = local_e8._4_4_;
      puVar28[0x16] = (undefined4)uStack_e0;
      puVar28[0x17] = uStack_e0._4_4_;
      puVar28[0x18] = local_c8._M_head_impl._0_4_;
      puVar28[0x19] = local_c8._M_head_impl._4_4_;
      puVar28[0x1a] = (undefined4)uStack_c0;
      puVar28[0x1b] = uStack_c0._4_4_;
      puVar28[0x1c] = (undefined4)local_b8;
      puVar28[0x1d] = local_b8._4_4_;
      puVar28[0x1e] = (undefined4)uStack_b0;
      puVar28[0x1f] = uStack_b0._4_4_;
      puVar28[0x20] = (undefined4)local_a8;
      puVar28[0x21] = local_a8._4_4_;
      puVar28[0x22] = (undefined4)uStack_a0;
      puVar28[0x23] = uStack_a0._4_4_;
      puVar28[0x24] = (undefined4)local_178;
      puVar28[0x25] = local_178._4_4_;
      puVar28[0x26] = uStack_170;
      puVar28[0x27] = uStack_16c;
      puVar28[0x28] = local_98[0];
      puVar28[0x29] = local_98[1];
      puVar28[0x2a] = local_98[2];
      puVar28[0x2b] = local_98[3];
      fVar10 = *(float *)&local_d8->objectID_;
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar8 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar16 = (topBuilder->refs).items;
      pBVar5 = pBVar16 + iVar8;
      (pBVar5->super_PrimRef).lower.field_0.m128[0] = local_88.m128[0];
      (pBVar5->super_PrimRef).lower.field_0.m128[1] = local_88.m128[1];
      (pBVar5->super_PrimRef).lower.field_0.m128[2] = local_88.m128[2];
      (pBVar5->super_PrimRef).lower.field_0.m128[3] = fVar10;
      pVVar7 = &pBVar16[iVar8].super_PrimRef.upper;
      (pVVar7->field_0).m128[0] = local_78;
      (pVVar7->field_0).m128[1] = fStack_74;
      (pVVar7->field_0).m128[2] = fStack_70;
      (pVVar7->field_0).m128[3] = 1.4013e-45;
      pBVar16[iVar8].node.ptr = (ulong)puVar28 | 9;
      pBVar16[iVar8].bounds_area = 0.0;
    } while (uVar35 < (ulong)(local_40 - local_48));
  }
  uVar26 = local_150._8_8_;
  if (local_140 != (PrimRef *)0x0) {
    if ((ulong)(local_150._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_140);
    }
    else {
      os_free(local_140,local_150._8_8_ << 5,local_160[8]);
    }
  }
  if (uVar26 != 0) {
    (***(_func_int ***)local_160._0_8_)(local_160._0_8_,uVar26 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }